

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::GeneratedMessageReflection::SetField<unsigned_long>
          (GeneratedMessageReflection *this,Message *message,FieldDescriptor *field,
          unsigned_long *value)

{
  unsigned_long uVar1;
  bool bVar2;
  OneofDescriptor *pOVar3;
  unsigned_long *puVar4;
  unsigned_long *value_local;
  FieldDescriptor *field_local;
  Message *message_local;
  GeneratedMessageReflection *this_local;
  
  pOVar3 = FieldDescriptor::containing_oneof(field);
  if (pOVar3 != (OneofDescriptor *)0x0) {
    bVar2 = HasOneofField(this,message,field);
    if (!bVar2) {
      pOVar3 = FieldDescriptor::containing_oneof(field);
      ClearOneof(this,message,pOVar3);
    }
  }
  uVar1 = *value;
  puVar4 = MutableRaw<unsigned_long>(this,message,field);
  *puVar4 = uVar1;
  pOVar3 = FieldDescriptor::containing_oneof(field);
  if (pOVar3 == (OneofDescriptor *)0x0) {
    SetBit(this,message,field);
  }
  else {
    SetOneofCase(this,message,field);
  }
  return;
}

Assistant:

inline void GeneratedMessageReflection::SetField(
    Message* message, const FieldDescriptor* field, const Type& value) const {
  if (field->containing_oneof() && !HasOneofField(*message, field)) {
    ClearOneof(message, field->containing_oneof());
  }
  *MutableRaw<Type>(message, field) = value;
  field->containing_oneof() ?
      SetOneofCase(message, field) : SetBit(message, field);
}